

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscCore.c
# Opt level: O2

Gia_Man_t * Ssc_PerformSweepingConstr(Gia_Man_t *p,Ssc_Pars_t *pPars)

{
  int *pPos;
  int Entry;
  Vec_Int_t *pVVar1;
  ulong uVar2;
  Gia_Man_t *pGVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *pAig;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  
  if (pPars->fVerbose != 0) {
    Abc_Print(0,"SAT sweeping AIG with %d constraints.\n",(ulong)(uint)p->nConstrs);
  }
  if (p->nConstrs == 0) {
    pGVar3 = Gia_ManDup(p);
    p_00 = Gia_ManStart(p->vCis->nSize + 2);
    pcVar4 = (char *)malloc(5);
    builtin_strncpy(pcVar4,"care",5);
    p_00->pName = pcVar4;
    for (iVar8 = 0; iVar8 < p->vCis->nSize; iVar8 = iVar8 + 1) {
      pGVar5 = Gia_ManAppendObj(p_00);
      uVar7 = *(ulong *)pGVar5;
      *(ulong *)pGVar5 = uVar7 | 0x9fffffff;
      *(ulong *)pGVar5 =
           uVar7 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pVVar1 = p_00->vCis;
      Entry = Gia_ObjId(p_00,pGVar5);
      Vec_IntPush(pVVar1,Entry);
      Gia_ObjId(p_00,pGVar5);
    }
    if (p_00->nObjs < 1) {
      __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x2ec,"int Gia_ManAppendCo(Gia_Man_t *, int)");
    }
    pGVar5 = Gia_ManObj(p_00,0);
    if ((~*(uint *)pGVar5 & 0x1fffffff) != 0 && (int)*(uint *)pGVar5 < 0) {
      __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x2ed,"int Gia_ManAppendCo(Gia_Man_t *, int)");
    }
    pGVar5 = Gia_ManAppendObj(p_00);
    *(ulong *)pGVar5 = *(ulong *)pGVar5 | 0x80000000;
    uVar6 = Gia_ObjId(p_00,pGVar5);
    uVar7 = *(ulong *)pGVar5;
    *(ulong *)pGVar5 = uVar7 & 0xffffffffc0000000 | (ulong)(uVar6 & 0x1fffffff);
    *(ulong *)pGVar5 =
         uVar7 & 0xe0000000c0000000 | (ulong)(uVar6 & 0x1fffffff) |
         (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
    pVVar1 = p_00->vCos;
    iVar8 = Gia_ObjId(p_00,pGVar5);
    Vec_IntPush(pVVar1,iVar8);
    if (p_00->pFanData != (int *)0x0) {
      Gia_ObjAddFanout(p_00,pGVar5 + -(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff),pGVar5);
    }
    Gia_ObjId(p_00,pGVar5);
  }
  else {
    uVar6 = p->vCos->nSize - p->nRegs;
    pVVar1 = Vec_IntAlloc(uVar6);
    uVar2 = 0;
    uVar7 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar7 = uVar2;
    }
    pPos = pVVar1->pArray;
    for (; uVar7 != uVar2; uVar2 = uVar2 + 1) {
      pPos[uVar2] = (int)uVar2;
    }
    pGVar3 = Gia_ManDupCones(p,pPos,p->vCos->nSize - (p->nRegs + p->nConstrs),0);
    p_00 = Gia_ManDupCones(p,pPos + (((long)p->vCos->nSize - (long)p->nRegs) - (long)p->nConstrs),
                           p->nConstrs,0);
    free(pPos);
    free(pVVar1);
  }
  if (pPars->fVerbose != 0) {
    printf("User AIG: ");
    Gia_ManPrintStats(pGVar3,(Gps_Par_t *)0x0);
    printf("Care AIG: ");
    Gia_ManPrintStats(p_00,(Gps_Par_t *)0x0);
  }
  pAig = Gia_ManDupLevelized(pGVar3);
  Gia_ManStop(pGVar3);
  pGVar3 = Ssc_PerformSweeping(pAig,p_00,pPars);
  if (pPars->fAppend != 0) {
    Gia_ManDupAppendShare(pGVar3,p_00);
    pGVar3->nConstrs = p_00->vCos->nSize - p_00->nRegs;
  }
  Gia_ManStop(pAig);
  Gia_ManStop(p_00);
  return pGVar3;
}

Assistant:

Gia_Man_t * Ssc_PerformSweepingConstr( Gia_Man_t * p, Ssc_Pars_t * pPars )
{
    Gia_Man_t * pAig, * pCare, * pResult;
    int i;
    if ( pPars->fVerbose )
        Abc_Print( 0, "SAT sweeping AIG with %d constraints.\n", p->nConstrs );
    if ( p->nConstrs == 0 )
    {
        pAig = Gia_ManDup( p );
        pCare = Gia_ManStart( Gia_ManCiNum(p) + 2 );
        pCare->pName = Abc_UtilStrsav( "care" );
        for ( i = 0; i < Gia_ManCiNum(p); i++ )
            Gia_ManAppendCi( pCare );
        Gia_ManAppendCo( pCare, 0 );
    }
    else
    {
        Vec_Int_t * vOuts = Vec_IntStartNatural( Gia_ManPoNum(p) );
        pAig = Gia_ManDupCones( p, Vec_IntArray(vOuts), Gia_ManPoNum(p) - p->nConstrs, 0 );
        pCare = Gia_ManDupCones( p, Vec_IntArray(vOuts) + Gia_ManPoNum(p) - p->nConstrs, p->nConstrs, 0 );
        Vec_IntFree( vOuts );
    }
    if ( pPars->fVerbose )
    {
        printf( "User AIG: " );
        Gia_ManPrintStats( pAig, NULL );
        printf( "Care AIG: " );
        Gia_ManPrintStats( pCare, NULL );
    }

    pAig = Gia_ManDupLevelized( pResult = pAig );
    Gia_ManStop( pResult );
    pResult = Ssc_PerformSweeping( pAig, pCare, pPars );
    if ( pPars->fAppend )
    {
        Gia_ManDupAppendShare( pResult, pCare );
        pResult->nConstrs = Gia_ManPoNum(pCare);
    }
    Gia_ManStop( pAig );
    Gia_ManStop( pCare );
    return pResult;
}